

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O0

bool __thiscall absl::lts_20240722::Mutex::AwaitCommon(Mutex *this,Condition *cond,KernelTimeout t)

{
  Mutex *timeout_arg;
  bool bVar1;
  undefined1 *how_arg;
  PerThreadSynch *thread_arg;
  bool local_d1;
  bool local_b9;
  char *absl_raw_log_internal_basename;
  bool res;
  undefined1 local_88 [8];
  SynchWaitParams waitp;
  MuHow how;
  Condition *cond_local;
  Mutex *this_local;
  KernelTimeout t_local;
  memory_order __b;
  
  this_local = (Mutex *)t.rep_;
  AssertReaderHeld(this);
  bVar1 = Condition::Eval(cond);
  if (bVar1) {
    t_local.rep_._7_1_ = true;
  }
  else {
    std::operator&(memory_order_relaxed,__memory_order_mask);
    timeout_arg = this_local;
    how_arg = kSharedS;
    if (((this->mu_).super___atomic_base<long>._M_i & 8U) != 0) {
      how_arg = kExclusiveS;
    }
    waitp._56_8_ = how_arg;
    thread_arg = Synch_GetPerThreadAnnotated(this);
    SynchWaitParams::SynchWaitParams
              ((SynchWaitParams *)local_88,(MuHow)how_arg,cond,(KernelTimeout)timeout_arg,
               (Mutex *)0x0,thread_arg,(atomic<long> *)0x0);
    UnlockSlow(this,(SynchWaitParams *)local_88);
    Block(this,(PerThreadSynch *)waitp.cvmu);
    LockSlowLoop(this,(SynchWaitParams *)local_88,3);
    local_b9 = true;
    if (waitp.how == (MuHow)0x0) {
      local_b9 = EvalConditionAnnotated(cond,this,true,false,(undefined1 *)waitp._56_8_ == kSharedS)
      ;
    }
    local_d1 = true;
    if (local_b9 == false) {
      local_d1 = synchronization_internal::KernelTimeout::has_timeout((KernelTimeout *)&this_local);
    }
    if (((local_d1 ^ 0xffU) & 1) != 0) {
      absl::lts_20240722::raw_log_internal::RawLog
                (kFatal,"mutex.cc",0x63e,"Check %s failed: %s","res || t.has_timeout()",
                 "condition untrue on return from Await");
      __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/absl-src/absl/synchronization/mutex.cc"
                    ,0x63e,"bool absl::Mutex::AwaitCommon(const Condition &, KernelTimeout)");
    }
    t_local.rep_._7_1_ = local_b9;
  }
  return t_local.rep_._7_1_;
}

Assistant:

bool Mutex::AwaitCommon(const Condition& cond, KernelTimeout t) {
  if (kDebugMode) {
    this->AssertReaderHeld();
  }
  if (cond.Eval()) {  // condition already true; nothing to do
    return true;
  }
  MuHow how =
      (mu_.load(std::memory_order_relaxed) & kMuWriter) ? kExclusive : kShared;
  ABSL_TSAN_MUTEX_PRE_UNLOCK(this, TsanFlags(how));
  SynchWaitParams waitp(how, &cond, t, nullptr /*no cvmu*/,
                        Synch_GetPerThreadAnnotated(this),
                        nullptr /*no cv_word*/);
  this->UnlockSlow(&waitp);
  this->Block(waitp.thread);
  ABSL_TSAN_MUTEX_POST_UNLOCK(this, TsanFlags(how));
  ABSL_TSAN_MUTEX_PRE_LOCK(this, TsanFlags(how));
  this->LockSlowLoop(&waitp, kMuHasBlocked | kMuIsCond);
  bool res = waitp.cond != nullptr ||  // => cond known true from LockSlowLoop
             EvalConditionAnnotated(&cond, this, true, false, how == kShared);
  ABSL_TSAN_MUTEX_POST_LOCK(this, TsanFlags(how), 0);
  ABSL_RAW_CHECK(res || t.has_timeout(),
                 "condition untrue on return from Await");
  return res;
}